

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  allocator<char> local_5c;
  char local_5b [8];
  char formatString [15];
  int len;
  char buffer [36];
  uint precision_local;
  bool useSpecialFloats_local;
  double value_local;
  
  formatString[7] = -1;
  formatString[8] = -1;
  formatString[9] = -1;
  formatString[10] = -1;
  snprintf(local_5b,0xf,"%%.%dg",CONCAT71(in_register_00000011,useSpecialFloats) & 0xffffffff);
  bVar1 = std::isfinite(value);
  if (bVar1) {
    formatString._7_4_ = snprintf(formatString + 0xb,0x24,local_5b,value);
    fixNumericLocale(formatString + 0xb,formatString + (long)(int)formatString._7_4_ + 0xb);
    pcVar2 = strchr(formatString + 0xb,0x2e);
    if ((pcVar2 == (char *)0x0) && (pcVar2 = strchr(formatString + 0xb,0x65), pcVar2 == (char *)0x0)
       ) {
      strcat(formatString + 0xb,".0");
    }
  }
  else if (NAN(value)) {
    pcVar2 = "null";
    if (((ulong)this & 1) != 0) {
      pcVar2 = "NaN";
    }
    formatString._7_4_ = snprintf(formatString + 0xb,0x24,pcVar2);
  }
  else if (0.0 <= value) {
    pcVar2 = "-1e+9999";
    if (((ulong)this & 1) != 0) {
      pcVar2 = "-Infinity";
    }
    formatString._7_4_ = snprintf(formatString + 0xb,0x24,pcVar2 + 1);
  }
  else {
    pcVar2 = "-1e+9999";
    if (((ulong)this & 1) != 0) {
      pcVar2 = "-Infinity";
    }
    formatString._7_4_ = snprintf(formatString + 0xb,0x24,pcVar2);
  }
  if (-1 < (int)formatString._7_4_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,formatString + 0xb,&local_5c);
    std::allocator<char>::~allocator(&local_5c);
    return __return_storage_ptr__;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0xcc,
                "std::string Json::(anonymous namespace)::valueToString(double, bool, unsigned int)"
               );
}

Assistant:

JSONCPP_STRING valueToString(double value, bool useSpecialFloats, unsigned int precision) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[36];
  int len = -1;

  char formatString[15];
  snprintf(formatString, sizeof(formatString), "%%.%dg", precision);

  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distingish the
  // concepts of reals and integers.
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), formatString, value);
    fixNumericLocale(buffer, buffer + len);

    // try to ensure we preserve the fact that this was given to us as a double on input
    if (!strchr(buffer, '.') && !strchr(buffer, 'e')) {
      strcat(buffer, ".0");
    }

  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "NaN" : "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "-Infinity" : "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "Infinity" : "1e+9999");
    }
  }
  assert(len >= 0);
  return buffer;
}